

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::BinaryAggregateHeap<float,_long,_duckdb::GreaterThan>::Insert
          (BinaryAggregateHeap<float,_long,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          float *key,long *value)

{
  float fVar1;
  pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_> *__first;
  bool bVar2;
  HeapEntry<long> HVar3;
  idx_t iVar4;
  ulong __holeIndex;
  STORAGE_TYPE *__first_00;
  pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_> __value;
  pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_> __value_00;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_>_&,_const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_>_&)>
  __cmp;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_>_&,_const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_>_&)>
  local_20;
  
  __first_00 = this->heap;
  __holeIndex = this->size;
  if (__holeIndex < this->capacity) {
    __first_00[__holeIndex].first.value = *key;
    __first_00[__holeIndex].second.value = *value;
    this->size = __holeIndex + 1;
    fVar1 = __first_00[__holeIndex].first.value;
    HVar3.value = __first_00[__holeIndex].second.value;
  }
  else {
    bVar2 = duckdb::GreaterThan::Operation<float>(key,(float *)__first_00);
    if (!bVar2) {
      return;
    }
    iVar4 = this->size;
    if (1 < (long)iVar4) {
      __first = this->heap;
      __value._4_4_ = 0;
      __value.first.value = __first[iVar4 - 1].first.value;
      HVar3.value = __first[iVar4 - 1].second.value;
      __first[iVar4 - 1].first.value = (__first->first).value;
      __first[iVar4 - 1].second.value = (__first->second).value;
      __value.second.value = HVar3.value;
      std::
      __adjust_heap<std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>*,long,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>const&,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>const&)>>
                (__first,0,(long)(iVar4 * 0x10 + -0x10) >> 4,__value,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_>_&,_const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_>_&)>
                  )Compare);
      iVar4 = this->size;
    }
    __first_00 = this->heap;
    fVar1 = *key;
    __first_00[iVar4 - 1].first.value = fVar1;
    HVar3.value = *value;
    __first_00[iVar4 - 1].second.value = HVar3.value;
    __holeIndex = ((long)(iVar4 * 0x10) >> 4) - 1;
  }
  local_20._M_comp = Compare;
  __value_00._4_4_ = 0;
  __value_00.first.value = fVar1;
  __value_00.second.value = HVar3.value;
  std::
  __push_heap<std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>*,long,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>const&,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>const&)>>
            (__first_00,__holeIndex,0,__value_00,&local_20);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}